

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_hash.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  option long_options [9];
  int local_16c;
  char *local_168;
  char *local_160;
  undefined1 local_158 [296];
  
  memcpy(local_158,&PTR_anon_var_dwarf_45_00108cc0,0x120);
  msgno = 0;
  local_16c = 10;
  local_160 = (char *)0x0;
  local_168 = (char *)0x0;
  do {
    while (iVar1 = getopt_long(argc,argv,"p:a:s:c:vqVH",local_158,0), 0x62 < iVar1) {
      switch(iVar1) {
      case 0x70:
        local_168 = _optarg;
        break;
      case 0x71:
        msgno = -1;
        break;
      case 0x72:
      case 0x74:
      case 0x75:
        goto switchD_0010150a_caseD_72;
      case 0x73:
        local_160 = _optarg;
        break;
      case 0x76:
        if (_optarg == (char *)0x0) {
          msgno = msgno + 1;
        }
        else {
          msgno = atoi(_optarg);
        }
        break;
      default:
        if (iVar1 != 99) goto switchD_0010150a_caseD_72;
        local_16c = atoi(_optarg);
      }
    }
  } while (iVar1 == 0x61);
  if (iVar1 == -1) {
    pcVar2 = password_hash(local_168,"bcrypt",local_160,local_16c);
    if (pcVar2 != (char *)0x0) {
      puts(pcVar2);
      free(pcVar2);
      return 0;
    }
  }
  else {
    if (iVar1 == 0x56) {
      printf("PHP Password Hashing version: %d.%d.%d\n",0,1,0);
      return 0;
    }
switchD_0010150a_caseD_72:
    pcVar2 = __xpg_basename(*argv);
    printf("Usage: %s -p <PASSWORD> [-a <ALGORITHM>] [-s <SALT>] [-c <COST>]\n\n",pcVar2);
    puts("  -p, --password=PASSWORD   users\'s password");
    printf("  -a, --algorithm=ALGORITHM hashing algorithm (no used) [DEFAULT: %s]\n","bcrypt");
    puts("  -s, --salt=SALT           salt to use when hashing the password");
    printf("  -c, --cost=COST           cost that should be used [DEFAULT: %d]\n",10);
    puts("  -V, --version             print version");
  }
  return -1;
}

Assistant:

int
main(int argc, char **argv)
{
    char *password = NULL, *salt = NULL;
    char *hash = NULL;
    char *algo = BCRYPT_BLOWFISH;
    int cost = BCRYPT_BLOWFISH_COST;

    int opt;
    const struct option long_options[] = {
        { "password", 1, NULL, 'p' },
        { "algorithm", 1, NULL, 'a' },
        { "salt", 1, NULL, 's' },
        { "cost", 1, NULL, 'c' },
        { "verbose", 1, NULL, 'v' },
        { "quiet", 0, NULL, 'q' },
        { "version", 0, NULL, 'V' },
        { "help", 0, NULL, 'H' },
        { NULL, 0, NULL, 0 }
    };

    msgno = 0;

    while ((opt = getopt_long(argc, argv, "p:a:s:c:vqVH",
                              long_options, NULL)) != -1) {
        switch (opt) {
            case 'p':
                password = optarg;
                break;
            case 'a':
                break;
            case 's':
                salt = optarg;
                break;
            case 'c':
                cost = atoi(optarg);
                break;
            case 'v':
                if (optarg) {
                    msgno = atoi(optarg);
                } else {
                    msgno += 1;
                }
                break;
            case 'q':
                msgno = -1;
                break;
            case 'V':
                printf("PHP Password Hashing version: %d.%d.%d\n",
                       PHP_PASSWORD_VERSION_MAJOR,
                       PHP_PASSWORD_VERSION_MINOR,
                       PHP_PASSWORD_VERSION_BUILD);
                return 0;
            case 'H':
            default:
                usage(argv[0]);
                return -1;
        }
    }

    hash = password_hash(password, algo, salt, cost);
    if (!hash) {
        return -1;
    }

    printf("%s\n", hash);

    free(hash);

    return 0;
}